

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryProvider.h
# Opt level: O0

void __thiscall FIX::DataDictionaryProvider::DataDictionaryProvider(DataDictionaryProvider *this)

{
  DataDictionaryProvider *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
  ::map(&this->m_transportDictionaries);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
  ::map(&this->m_applicationDictionaries);
  FIX::DataDictionary::DataDictionary(&this->emptyDataDictionary);
  return;
}

Assistant:

DataDictionaryProvider() {}